

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

RegOpnd * __thiscall
Lowerer::GenerateFunctionTypeFromFixedFunctionObject
          (Lowerer *this,Instr *insertInstrPt,Opnd *functionObjOpnd)

{
  Var pvVar1;
  bool bVar2;
  uint32 uVar3;
  RegOpnd *dst;
  AddrOpnd *pAVar4;
  RegOpnd *baseOpnd;
  AddrOpnd *functionObjAddrOpnd;
  Opnd *functionTypeOpnd;
  RegOpnd *functionTypeRegOpnd;
  Opnd *functionObjOpnd_local;
  Instr *insertInstrPt_local;
  Lowerer *this_local;
  
  dst = IR::RegOpnd::New(TyInt64,this->m_func);
  bVar2 = IR::Opnd::IsAddrOpnd(functionObjOpnd);
  if (bVar2) {
    pAVar4 = IR::Opnd::AsAddrOpnd(functionObjOpnd);
    pvVar1 = pAVar4->m_address;
    uVar3 = Js::RecyclableObject::GetOffsetOfType();
    functionObjAddrOpnd =
         (AddrOpnd *)
         IR::MemRefOpnd::New((void *)((long)pvVar1 + (ulong)uVar3),TyUint64,this->m_func,
                             AddrOpndKindDynamicObjectTypeRef);
  }
  else {
    baseOpnd = IR::Opnd::AsRegOpnd(functionObjOpnd);
    uVar3 = Js::RecyclableObject::GetOffsetOfType();
    functionObjAddrOpnd = (AddrOpnd *)IR::IndirOpnd::New(baseOpnd,uVar3,TyUint64,this->m_func,false)
    ;
  }
  InsertMove(&dst->super_Opnd,&functionObjAddrOpnd->super_Opnd,insertInstrPt,true);
  return dst;
}

Assistant:

IR::RegOpnd*
Lowerer::GenerateFunctionTypeFromFixedFunctionObject(IR::Instr *insertInstrPt, IR::Opnd* functionObjOpnd)
{
    IR::RegOpnd * functionTypeRegOpnd = IR::RegOpnd::New(TyMachReg, this->m_func);
    IR::Opnd *functionTypeOpnd = nullptr;

    if(functionObjOpnd->IsAddrOpnd())
    {
        IR::AddrOpnd* functionObjAddrOpnd = functionObjOpnd->AsAddrOpnd();
        // functionTypeRegOpnd = MOV [fixed function address + type offset]
        functionObjAddrOpnd->m_address;
        functionTypeOpnd = IR::MemRefOpnd::New((void *)((intptr_t)functionObjAddrOpnd->m_address + Js::RecyclableObject::GetOffsetOfType()), TyMachPtr, this->m_func,
            IR::AddrOpndKindDynamicObjectTypeRef);
    }
    else
    {
        functionTypeOpnd = IR::IndirOpnd::New(functionObjOpnd->AsRegOpnd(), Js::RecyclableObject::GetOffsetOfType(), TyMachPtr, this->m_func);
    }
    Lowerer::InsertMove(functionTypeRegOpnd, functionTypeOpnd, insertInstrPt);
    return functionTypeRegOpnd;
}